

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algebra.h
# Opt level: O0

Vector<std::complex<float>,_4UL> *
Gs::operator*(Vector<std::complex<float>,_4UL> *__return_storage_ptr__,
             Matrix<std::complex<float>,_4UL,_4UL> *lhs,Vector<std::complex<float>,_4UL> *rhs)

{
  complex<float> *pcVar1;
  complex<float> *__y;
  complex<float> local_40;
  ulong local_38;
  size_t c;
  ulong local_28;
  size_t r;
  Vector<std::complex<float>,_4UL> *rhs_local;
  Matrix<std::complex<float>,_4UL,_4UL> *lhs_local;
  Vector<std::complex<float>,_4UL> *result;
  
  r = (size_t)rhs;
  rhs_local = (Vector<std::complex<float>,_4UL> *)lhs;
  lhs_local = (Matrix<std::complex<float>,_4UL,_4UL> *)__return_storage_ptr__;
  Vector<std::complex<float>,_4UL>::Vector(__return_storage_ptr__);
  for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
    std::complex<float>::complex((complex<float> *)&c,0.0,0.0);
    pcVar1 = Vector<std::complex<float>,_4UL>::operator[](__return_storage_ptr__,local_28);
    pcVar1->_M_value = c;
    for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
      pcVar1 = Matrix<std::complex<float>,_4UL,_4UL>::operator()
                         ((Matrix<std::complex<float>,_4UL,_4UL> *)rhs_local,local_28,local_38);
      __y = Vector<std::complex<float>,_4UL>::operator[]
                      ((Vector<std::complex<float>,_4UL> *)r,local_38);
      std::operator*(pcVar1,__y);
      pcVar1 = Vector<std::complex<float>,_4UL>::operator[](__return_storage_ptr__,local_28);
      std::complex<float>::operator+=(pcVar1,&local_40);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<T, Rows> operator * (const Matrix<T, Rows, Cols>& lhs, const Vector<T, Cols>& rhs)
{
    Vector<T, Rows> result;

    for (std::size_t r = 0; r < Rows; ++r)
    {
        result[r] = T(0);
        for (std::size_t c = 0; c < Cols; ++c)
            result[r] += lhs(r, c)*rhs[c];
    }

    return result;
}